

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_Recovery::_Test_Recovery(_Test_Recovery *this)

{
  _Test_Recovery *this_local;
  
  CorruptionTest::CorruptionTest(&this->super_CorruptionTest);
  return;
}

Assistant:

TEST(CorruptionTest, Recovery) {
  Build(100);
  Check(100, 100);
  Corrupt(kLogFile, 19, 1);  // WriteBatch tag for first record
  Corrupt(kLogFile, log::kBlockSize + 1000, 1);  // Somewhere in second block
  Reopen();

  // The 64 records in the first two log blocks are completely lost.
  Check(36, 36);
}